

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleConfigLoader.cpp
# Opt level: O0

bool __thiscall SimpleConfigLoader::loadConfiguration(SimpleConfigLoader *this)

{
  uint uVar1;
  char *pcVar2;
  FILE *__stream;
  size_t sVar3;
  undefined8 uVar4;
  SimpleConfigLoader *this_00;
  bool boolValue;
  string stringValue;
  string stringName;
  char *trimmedValue;
  char *value;
  char *trimmedName;
  char *name;
  size_t line;
  char fileBuf [1024];
  FILE *fp;
  char *configPath;
  string *in_stack_fffffffffffff9e8;
  Configuration *in_stack_fffffffffffff9f0;
  Configuration *in_stack_fffffffffffff9f8;
  Configuration *in_stack_fffffffffffffa00;
  undefined7 in_stack_fffffffffffffa08;
  byte in_stack_fffffffffffffa0f;
  Configuration *in_stack_fffffffffffffa18;
  Configuration *in_stack_fffffffffffffa20;
  string local_598 [32];
  string local_578 [40];
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [55];
  allocator local_471;
  string local_470 [32];
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  long local_430;
  char local_428 [216];
  bool local_1;
  
  pcVar2 = getConfigPath((SimpleConfigLoader *)in_stack_fffffffffffff9f8);
  __stream = fopen(pcVar2,"r");
  if (__stream == (FILE *)0x0) {
    softHSMLog(3,"loadConfiguration",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
               ,0x54,"Could not open the config file: %s",pcVar2);
    free(pcVar2);
    local_1 = false;
  }
  else {
    free(pcVar2);
    local_430 = 0;
    while (pcVar2 = fgets(local_428,0x400,__stream), pcVar2 != (char *)0x0) {
      local_430 = local_430 + 1;
      sVar3 = strcspn(local_428,"#\n\r");
      local_428[sVar3] = '\0';
      if (local_428[0] != '\0') {
        local_438 = strtok(local_428,"=");
        if (local_438 == (char *)0x0) {
          softHSMLog(4,"loadConfiguration",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
                     ,0x73,"Bad format on line %lu, skip",local_430);
        }
        else {
          local_440 = trimString((SimpleConfigLoader *)
                                 CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08),
                                 (char *)in_stack_fffffffffffffa00);
          if (local_440 == (char *)0x0) {
            softHSMLog(4,"loadConfiguration",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
                       ,0x7b,"Bad format on line %lu, skip",local_430);
          }
          else {
            local_448 = strtok((char *)0x0,"=");
            if (local_448 == (char *)0x0) {
              softHSMLog(4,"loadConfiguration",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
                         ,0x82,"Bad format on line %lu, skip",local_430);
              free(local_440);
            }
            else {
              local_450 = trimString((SimpleConfigLoader *)
                                     CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08),
                                     (char *)in_stack_fffffffffffffa00);
              pcVar2 = local_440;
              if (local_450 == (char *)0x0) {
                softHSMLog(4,"loadConfiguration",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
                           ,0x8b,"Bad format on line %lu, skip",local_430);
                free(local_440);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_470,pcVar2,&local_471);
                std::allocator<char>::~allocator((allocator<char> *)&local_471);
                pcVar2 = local_450;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_4a8,pcVar2,&local_4a9);
                std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
                free(local_440);
                free(local_450);
                Configuration::i();
                std::__cxx11::string::string(local_4d0,local_470);
                uVar1 = Configuration::getType
                                  (in_stack_fffffffffffff9f8,(string *)in_stack_fffffffffffff9f0);
                std::__cxx11::string::~string(local_4d0);
                this_00 = (SimpleConfigLoader *)(ulong)uVar1;
                switch(this_00) {
                case (SimpleConfigLoader *)0x0:
                default:
                  in_stack_fffffffffffff9f8 = (Configuration *)std::__cxx11::string::c_str();
                  in_stack_fffffffffffff9e8 = (string *)std::__cxx11::string::c_str();
                  softHSMLog(4,"loadConfiguration",
                             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
                             ,0xaf,"The following configuration is not supported: %s = %s",
                             in_stack_fffffffffffff9f8);
                  break;
                case (SimpleConfigLoader *)0x1:
                  in_stack_fffffffffffffa20 = Configuration::i();
                  std::__cxx11::string::string(local_4f0,local_470);
                  std::__cxx11::string::string(local_510,local_4a8);
                  Configuration::setString
                            (in_stack_fffffffffffffa00,(string *)in_stack_fffffffffffff9f8,
                             (string *)in_stack_fffffffffffff9f0);
                  std::__cxx11::string::~string(local_510);
                  std::__cxx11::string::~string(local_4f0);
                  break;
                case (SimpleConfigLoader *)0x2:
                  in_stack_fffffffffffffa18 = Configuration::i();
                  std::__cxx11::string::string(local_530,local_470);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  atoi(pcVar2);
                  Configuration::setInt(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,0);
                  std::__cxx11::string::~string(local_530);
                  break;
                case (SimpleConfigLoader *)0x3:
                  Configuration::i();
                  std::__cxx11::string::string(local_550,local_470);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  strtol(pcVar2,(char **)0x0,8);
                  Configuration::setInt(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,0);
                  std::__cxx11::string::~string(local_550);
                  break;
                case (SimpleConfigLoader *)0x4:
                  std::__cxx11::string::string(local_578,local_4a8);
                  in_stack_fffffffffffffa0f =
                       string2bool(this_00,(string *)in_stack_fffffffffffffa20,
                                   (bool *)in_stack_fffffffffffffa18);
                  std::__cxx11::string::~string(local_578);
                  if ((in_stack_fffffffffffffa0f & 1) == 0) {
                    uVar4 = std::__cxx11::string::c_str();
                    softHSMLog(4,"loadConfiguration",
                               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
                               ,0xa9,"The value %s is not a boolean",uVar4);
                  }
                  else {
                    in_stack_fffffffffffffa00 = Configuration::i();
                    std::__cxx11::string::string(local_598,local_470);
                    Configuration::setBool
                              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,false);
                    std::__cxx11::string::~string(local_598);
                  }
                }
                std::__cxx11::string::~string(local_4a8);
                std::__cxx11::string::~string(local_470);
              }
            }
          }
        }
      }
    }
    fclose(__stream);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SimpleConfigLoader::loadConfiguration()
{
	char* configPath = getConfigPath();

	FILE* fp = fopen(configPath,"r");

	if (fp == NULL)
	{
		ERROR_MSG("Could not open the config file: %s", configPath);
		free(configPath);
		return false;
	}
	free(configPath);

	char fileBuf[1024];

	// Format in config file
	//
	// <name> = <value>
	// # Line is ignored

	size_t line = 0;
	while (fgets(fileBuf, sizeof(fileBuf), fp) != NULL)
	{
		line++;

		// End the string at the first comment or newline
		fileBuf[strcspn(fileBuf, "#\n\r")] = '\0';

		// Skip empty lines
		if (fileBuf[0] == '\0')
		{
			continue;
		}

		// Get the first part of the line
		char* name = strtok(fileBuf, "=");
		if (name == NULL)
		{
			WARNING_MSG("Bad format on line %lu, skip", (unsigned long)line);
			continue;
		}

		// Trim the name
		char* trimmedName = trimString(name);
		if (trimmedName == NULL)
		{
			WARNING_MSG("Bad format on line %lu, skip", (unsigned long)line);
			continue;
		}

		// Get the second part of the line
		char* value = strtok(NULL, "=");
		if(value == NULL) {
			WARNING_MSG("Bad format on line %lu, skip", (unsigned long)line);
			free(trimmedName);
			continue;
		}

		// Trim the value
		char* trimmedValue = trimString(value);
		if (trimmedValue == NULL)
		{
			WARNING_MSG("Bad format on line %lu, skip", (unsigned long)line);
			free(trimmedName);
			continue;
		}

		// Save name,value
		std::string stringName(trimmedName);
		std::string stringValue(trimmedValue);
		free(trimmedName);
		free(trimmedValue);

		switch (Configuration::i()->getType(stringName))
		{
			case CONFIG_TYPE_STRING:
				Configuration::i()->setString(stringName, stringValue);
				break;
			case CONFIG_TYPE_INT:
				Configuration::i()->setInt(stringName, atoi(stringValue.c_str()));
				break;
			case CONFIG_TYPE_INT_OCTAL:
				Configuration::i()->setInt(stringName, strtol(stringValue.c_str(), NULL, 8));
				break;
			case CONFIG_TYPE_BOOL:
				bool boolValue;
				if (string2bool(stringValue, &boolValue))
				{
					Configuration::i()->setBool(stringName, boolValue);
				}
				else
				{
					WARNING_MSG("The value %s is not a boolean", stringValue.c_str());
				}
				break;
			case CONFIG_TYPE_UNSUPPORTED:
			default:
				WARNING_MSG("The following configuration is not supported: %s = %s",
					stringName.c_str(), stringValue.c_str());
				break;
		}
	}

	fclose(fp);

	return true;
}